

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O1

void __thiscall
deqp::sl::ShaderCase::dumpValues(ShaderCase *this,ValueBlock *valueBlock,int arrayNdx)

{
  pointer pVVar1;
  _Alloc_hider __s;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  DataType dataType;
  long lVar9;
  ostringstream *this_00;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  attribValues;
  ostringstream result;
  undefined1 auStack_3a8 [8];
  ulong local_3a0;
  uint local_398;
  float local_394;
  uint local_390;
  int local_38c;
  ulong local_388;
  ulong local_380;
  long *local_378;
  long local_370;
  long local_368 [2];
  ShaderCase *local_358;
  ValueBlock *local_350;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_348;
  undefined1 local_328 [376];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_348.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388 = ((long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  local_38c = arrayNdx;
  local_358 = this;
  local_350 = valueBlock;
  if (0 < (int)(uint)local_388) {
    local_388 = (ulong)((uint)local_388 & 0x7fffffff);
    uVar11 = 0;
    do {
      pVVar1 = (local_350->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __s._M_p = pVVar1[uVar11].valueName._M_dataplus._M_p;
      local_3a0 = (ulong)pVVar1[uVar11].dataType;
      iVar2 = glu::getDataTypeScalarSize(pVVar1[uVar11].dataType);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"    ",4);
      pVVar1 = pVVar1 + uVar11;
      uVar5 = (ulong)pVVar1->storageType;
      if (uVar5 < 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,&DAT_01bca458 + *(int *)(&DAT_01bca458 + uVar5 * 4),
                   *(long *)(&DAT_01bca468 + uVar5 * 8));
      }
      pcVar6 = glu::getDataTypeName((DataType)local_3a0);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)auStack_3a8 + (int)*(_func_int **)(local_328._0_8_ + -0x18) + 0x80);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
      if (__s._M_p == (char *)0x0) {
        std::ios::clear((int)auStack_3a8 + (int)*(_func_int **)(local_328._0_8_ + -0x18) + 0x80);
      }
      else {
        sVar7 = strlen(__s._M_p);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,__s._M_p,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,":",1);
      uVar5 = local_3a0;
      lVar9 = 3;
      if ((uint)local_3a0 < 0x24) {
        if ((0x77003801cU >> (local_3a0 & 0x3f) & 1) == 0) {
          if ((0x888004002U >> (local_3a0 & 0x3f) & 1) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
            if (((uint)local_3a0 < 0x23) && ((0x77003801cU >> (uVar5 & 0x3f) & 1) != 0))
            goto LAB_00dba47c;
          }
          goto LAB_00dba6d0;
        }
LAB_00dba47c:
        pcVar6 = " [ ";
LAB_00dba483:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,lVar9);
      }
      else {
LAB_00dba6d0:
        iVar10 = (int)local_3a0;
        pcVar6 = " [ ";
        if (iVar10 - 0x24U < 3) goto LAB_00dba483;
        lVar9 = 1;
        pcVar6 = "\n";
        if (iVar10 - 5U < 9 || iVar10 - 0x12U < 9) goto LAB_00dba483;
      }
      dataType = (DataType)local_3a0;
      local_380 = uVar11;
      if (((dataType < TYPE_BOOL) && ((0x7f803c01eU >> (uVar5 & 0x3f) & 1) != 0)) ||
         (dataType - TYPE_BOOL < 4)) {
        if (0 < iVar2) {
          local_394 = (float)(dataType - TYPE_INT);
          local_398 = dataType - TYPE_BOOL;
          iVar10 = 0;
          do {
            iVar12 = 0;
            if (pVVar1->arrayLength != 1) {
              iVar12 = local_38c;
            }
            lVar9 = *(long *)&(pVVar1->elements).
                              super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                              ._M_impl.super__Vector_impl_data;
            pcVar6 = " , ";
            if (iVar10 == 0) {
              pcVar6 = glcts::fixed_sample_locations_values;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,(bool *)pcVar6 + 1,(ulong)((uint)(iVar10 != 0) * 2));
            lVar8 = (long)(iVar12 * iVar2 + iVar10);
            if (dataType - TYPE_FLOAT < 4) {
              std::ostream::_M_insert<double>((double)*(float *)(lVar9 + lVar8 * 4));
            }
            else if ((uint)local_394 < 4) {
              std::ostream::operator<<(local_328,*(int *)(lVar9 + lVar8 * 4));
            }
            else if (local_398 < 4) {
              bVar14 = *(int *)(lVar9 + lVar8 * 4) == 0;
              pcVar6 = "false";
              if (!bVar14) {
                pcVar6 = "true";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,pcVar6,(ulong)bVar14 | 4);
            }
            iVar10 = iVar10 + 1;
          } while (iVar2 != iVar10);
        }
      }
      else if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
        local_390 = glu::getDataTypeMatrixNumRows(dataType);
        iVar10 = glu::getDataTypeMatrixNumColumns(dataType);
        if (0 < (int)local_390) {
          iVar12 = 0;
          uVar3 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"       [ ",9);
            local_398 = uVar3;
            if (0 < iVar10) {
              iVar13 = 0;
              do {
                iVar4 = 0;
                if (pVVar1->arrayLength != 1) {
                  iVar4 = local_38c;
                }
                local_394 = *(float *)(*(long *)&(pVVar1->elements).
                                                 super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                                                 ._M_impl.super__Vector_impl_data +
                                      (long)(iVar4 * iVar2 + iVar12 + iVar13) * 4);
                pcVar6 = " , ";
                if (iVar13 == 0) {
                  pcVar6 = glcts::fixed_sample_locations_values;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_328,(bool *)pcVar6 + 1,(ulong)((uint)(iVar13 != 0) * 2))
                ;
                std::ostream::_M_insert<double>((double)local_394);
                iVar13 = iVar13 + 1;
              } while (iVar10 != iVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ]\n",3);
            uVar3 = local_398 + 1;
            iVar12 = iVar12 + iVar10;
          } while (uVar3 != local_390);
        }
      }
      uVar11 = local_380;
      uVar3 = (int)local_3a0 - 1;
      if ((uVar3 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        pcVar6 = &DAT_01bca2b4 + *(int *)(&DAT_01bca2b4 + (ulong)uVar3 * 4);
        lVar9 = *(long *)(&DAT_01bca340 + (ulong)uVar3 * 8);
LAB_00dba603:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar6,lVar9);
      }
      else {
        lVar9 = 3;
        pcVar6 = " ]\n";
        if ((int)local_3a0 - 0x24U < 3) goto LAB_00dba603;
      }
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = ((local_358->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)local_378,local_370);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_378 != local_368) {
        operator_delete(local_378,local_368[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base((ios_base *)(local_328 + 0x70));
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_388);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_348);
  return;
}

Assistant:

void ShaderCase::dumpValues(const ValueBlock& valueBlock, int arrayNdx)
{
	vector<vector<float> > attribValues;

	int numValues = (int)valueBlock.values.size();
	for (int valNdx = 0; valNdx < numValues; valNdx++)
	{
		const ShaderCase::Value& val		= valueBlock.values[valNdx];
		const char*				 valueName  = val.valueName.c_str();
		DataType				 dataType   = val.dataType;
		int						 scalarSize = getDataTypeScalarSize(val.dataType);
		ostringstream			 result;

		result << "    ";
		if (val.storageType == Value::STORAGE_INPUT)
			result << "input ";
		else if (val.storageType == Value::STORAGE_UNIFORM)
			result << "uniform ";
		else if (val.storageType == Value::STORAGE_OUTPUT)
			result << "expected ";

		result << getDataTypeName(dataType) << " " << valueName << ":";

		if (isDataTypeScalar(dataType))
			result << " ";
		if (isDataTypeVector(dataType))
			result << " [ ";
		else if (isDataTypeMatrix(dataType))
			result << "\n";

		if (isDataTypeScalarOrVector(dataType))
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			{
				int					  elemNdx = (val.arrayLength == 1) ? 0 : arrayNdx;
				const Value::Element& e		  = val.elements[elemNdx * scalarSize + scalarNdx];
				result << ((scalarNdx != 0) ? ", " : "");

				if (isDataTypeFloatOrVec(dataType))
					result << e.float32;
				else if (isDataTypeIntOrIVec(dataType))
					result << e.int32;
				else if (isDataTypeBoolOrBVec(dataType))
					result << (e.bool32 ? "true" : "false");
			}
		}
		else if (isDataTypeMatrix(dataType))
		{
			int numRows = getDataTypeMatrixNumRows(dataType);
			int numCols = getDataTypeMatrixNumColumns(dataType);
			for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
			{
				result << "       [ ";
				for (int colNdx = 0; colNdx < numCols; colNdx++)
				{
					int   elemNdx = (val.arrayLength == 1) ? 0 : arrayNdx;
					float v		  = val.elements[elemNdx * scalarSize + rowNdx * numCols + colNdx].float32;
					result << ((colNdx == 0) ? "" : ", ") << v;
				}
				result << " ]\n";
			}
		}

		if (isDataTypeScalar(dataType))
			result << "\n";
		else if (isDataTypeVector(dataType))
			result << " ]\n";

		m_testCtx.getLog() << TestLog::Message << result.str() << TestLog::EndMessage;
	}
}